

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::filterTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   *__return_storage_ptr__,
                  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  TestCaseHandle *pTVar1;
  ITestInvoker *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t in_R8;
  TestCaseHandle *testCase;
  TestCaseHandle *__args;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> filtered;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_48;
  
  local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl
  .super__Vector_impl_data._M_finish = (TestCaseHandle *)0x0;
  local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (TestCaseHandle *)0x0;
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
            (&local_48,
             (long)(testCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(testCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  __args = (testCases->
           super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (testCases->
           super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__args == pTVar1) {
      uVar5 = (*config->_vptr_IConfig[0x12])(config);
      uVar6 = (*config->_vptr_IConfig[0x13])(config);
      createShard<std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>
                (__return_storage_ptr__,(Catch *)&local_48,
                 (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                 (ulong)uVar5,(ulong)uVar6,in_R8);
      if (local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    if ((testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if ((__args->m_info->properties & IsHidden) == None) goto LAB_0014baeb;
    }
    else {
      bVar3 = TestSpec::matches(testSpec,__args->m_info);
      if ((bVar3) &&
         (((__args->m_info->properties & Throws) == None ||
          (iVar4 = (*config->_vptr_IConfig[2])(config), (char)iVar4 != '\0')))) {
LAB_0014baeb:
        if (local_48.
            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_48.
            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
          _M_realloc_insert<Catch::TestCaseHandle_const&>
                    ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)
                     &local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          pIVar2 = __args->m_invoker;
          (local_48.
           super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl
           .super__Vector_impl_data._M_finish)->m_info = __args->m_info;
          (local_48.
           super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl
           .super__Vector_impl_data._M_finish)->m_invoker = pIVar2;
          local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    __args = __args + 1;
  } while( true );
}

Assistant:

std::vector<TestCaseHandle> filterTests( std::vector<TestCaseHandle> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCaseHandle> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.getTestCaseInfo().isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return createShard(filtered, config.shardCount(), config.shardIndex());
    }